

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::im2col_sgemm_pack8to1_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint _h;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int *piVar21;
  byte bVar22;
  uint _c;
  int iVar23;
  undefined1 (*pauVar24) [16];
  undefined8 *puVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  char *kptr0;
  undefined1 (*pauVar33) [32];
  undefined1 (*pauVar34) [16];
  undefined8 *puVar35;
  ulong uVar36;
  void *pvVar37;
  ulong uVar38;
  undefined1 (*pauVar39) [32];
  long lVar40;
  undefined4 *puVar41;
  ulong uVar42;
  undefined4 *puVar43;
  undefined4 *puVar44;
  int q;
  ulong uVar45;
  undefined4 *puVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 local_108 [64];
  size_t local_c8;
  ulong local_c0;
  Mat *local_b8;
  void *local_b0;
  long local_a8;
  ulong local_a0;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  uVar3 = bottom_im2col->w;
  uVar47 = (ulong)(int)uVar3;
  uVar30 = bottom_im2col->h;
  _h = bottom_im2col->c;
  local_c0 = (ulong)top_blob->c;
  local_c8 = 0;
  local_108._0_8_ = (void *)0x0;
  local_108._8_4_ = 0;
  local_108._12_4_ = 0;
  local_108._16_8_ = 0;
  local_108._24_4_ = 0;
  local_108._32_8_ = (Allocator *)0x0;
  local_108._40_4_ = 0;
  local_108._44_4_ = 0;
  local_108._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar47 < 4) {
    _c = uVar3;
    uVar27 = uVar30;
    if (1 < (int)uVar3) {
      uVar27 = uVar30 * 2;
      _c = (uVar3 & 1) + 1;
    }
  }
  else {
    _c = (uVar3 & 1) + (uVar3 >> 2) + (uint)((uVar3 >> 1 & 1) != 0);
    uVar27 = uVar30 * 4;
  }
  local_b8 = top_blob;
  Mat::create((Mat *)local_108,uVar27,_h,_c,8,8,opt->workspace_allocator);
  uVar31 = 0;
  local_98._0_8_ = CONCAT44(0,uVar30);
  uVar29 = 0;
  if (0 < (int)uVar30) {
    uVar29 = CONCAT44(0,uVar30);
  }
  uVar42 = 0;
  if (0 < (int)_h) {
    uVar42 = (ulong)_h;
  }
  uVar32 = (ulong)(uint)((int)uVar3 >> 2);
  if ((int)uVar3 >> 2 < 1) {
    uVar32 = uVar31;
  }
  for (uVar38 = 0; uVar38 != uVar32; uVar38 = uVar38 + 1) {
    pauVar39 = (undefined1 (*) [32])(local_c8 * uVar38 * local_108._16_8_ + local_108._0_8_);
    for (uVar45 = 0; uVar45 != uVar42; uVar45 = uVar45 + 1) {
      pauVar33 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar45 + uVar31);
      uVar36 = uVar29;
      while (iVar23 = (int)uVar36, uVar36 = (ulong)(iVar23 - 1), iVar23 != 0) {
        *pauVar39 = *pauVar33;
        pauVar39 = pauVar39 + 1;
        pauVar33 = (undefined1 (*) [32])(*pauVar33 + uVar47 * 8);
      }
    }
    uVar31 = uVar31 + 0x20;
  }
  uVar27 = uVar3 >> 1 & 1;
  lVar40 = (uVar47 & 0xfffffffffffffffc) << 3;
  for (uVar31 = 0; iVar23 = (int)(uVar47 & 0xfffffffffffffffc), uVar31 != uVar27;
      uVar31 = uVar31 + 1) {
    iVar23 = iVar23 + (int)uVar31 * 2;
    pauVar24 = (undefined1 (*) [16])
               ((long)((iVar23 % 4 >> 1) + iVar23 / 4) * local_c8 * local_108._16_8_ +
               local_108._0_8_);
    for (uVar32 = 0; uVar32 != uVar42; uVar32 = uVar32 + 1) {
      pauVar34 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar32 + lVar40);
      uVar38 = uVar29;
      while (iVar23 = (int)uVar38, uVar38 = (ulong)(iVar23 - 1), iVar23 != 0) {
        *pauVar24 = *pauVar34;
        pauVar24 = pauVar24 + 1;
        pauVar34 = (undefined1 (*) [16])(*pauVar34 + uVar47 * 8);
      }
    }
    lVar40 = lVar40 + 0x10;
  }
  uVar31 = (ulong)(int)(iVar23 + uVar27 * 2);
  lVar40 = uVar31 * 8;
  for (; (long)uVar31 < (long)uVar47; uVar31 = uVar31 + 1) {
    uVar27 = (int)uVar31 >> 0x1f;
    uVar32 = (ulong)uVar27 << 0x20 | uVar31 & 0xffffffff;
    puVar25 = (undefined8 *)
              ((long)((int)((long)((ulong)uVar27 << 0x20 | uVar31 & 0xffffffff) % 2) +
                      (int)((long)uVar32 / 4) + (int)(char)((char)((long)uVar32 % 4) / '\x02')) *
               local_c8 * local_108._16_8_ + local_108._0_8_);
    pvVar4 = bottom_im2col->data;
    for (uVar32 = 0; uVar32 != uVar42; uVar32 = uVar32 + 1) {
      puVar35 = (undefined8 *)
                ((long)pvVar4 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar32 + lVar40);
      uVar38 = uVar29;
      while (iVar23 = (int)uVar38, uVar38 = (ulong)(iVar23 - 1), iVar23 != 0) {
        *puVar25 = *puVar35;
        puVar25 = puVar25 + 1;
        puVar35 = puVar35 + uVar47;
      }
    }
    lVar40 = lVar40 + 8;
  }
  uVar27 = (int)local_c0 >> 2;
  local_a8 = local_b8->elemsize * local_b8->cstep;
  uVar31 = 0;
  uVar29 = (ulong)(_h * uVar30);
  if ((int)(_h * uVar30) < 1) {
    uVar29 = uVar31;
  }
  local_b0 = local_b8->data;
  local_a0 = (ulong)uVar27;
  if ((int)uVar27 < 1) {
    local_a0 = uVar31;
  }
  for (; iVar23 = (int)uVar29, uVar31 != local_a0; uVar31 = uVar31 + 1) {
    puVar41 = (undefined4 *)(uVar31 * 4 * local_a8 + (long)local_b0);
    puVar43 = (undefined4 *)((uVar31 * 4 + 1) * local_a8 + (long)local_b0);
    puVar44 = (undefined4 *)((uVar31 * 4 + 2) * local_a8 + (long)local_b0);
    puVar46 = (undefined4 *)((uVar31 * 4 + 3) * local_a8 + (long)local_b0);
    lVar40 = kernel->cstep * kernel->elemsize * uVar31;
    pvVar4 = kernel->data;
    pvVar37 = (void *)local_108._0_8_;
    for (uVar42 = 0; (long)(uVar42 | 3) < (long)uVar47; uVar42 = uVar42 + 4) {
      auVar62 = ZEXT1664((undefined1  [16])0x0);
      lVar26 = 0;
      auVar64 = ZEXT1664((undefined1  [16])0x0);
      auVar66 = ZEXT1664((undefined1  [16])0x0);
      auVar52 = ZEXT1664((undefined1  [16])0x0);
      auVar54 = ZEXT1664((undefined1  [16])0x0);
      auVar56 = ZEXT1664((undefined1  [16])0x0);
      auVar58 = ZEXT1664((undefined1  [16])0x0);
      auVar60 = ZEXT1664((undefined1  [16])0x0);
      uVar32 = uVar29;
      while( true ) {
        iVar28 = (int)uVar32;
        uVar32 = (ulong)(iVar28 - 1);
        auVar49 = auVar58._0_32_;
        auVar59 = auVar60._0_32_;
        auVar53 = auVar54._0_32_;
        auVar55 = auVar56._0_32_;
        auVar51 = auVar52._0_32_;
        auVar65 = auVar66._0_32_;
        auVar61 = auVar62._0_32_;
        auVar63 = auVar64._0_32_;
        if (iVar28 == 0) break;
        auVar10 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar37 + lVar26));
        auVar11 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar4 + lVar26 + lVar40));
        auVar14 = vpmullw_avx2(auVar11,auVar10);
        auVar12 = vpmulhw_avx2(auVar10,auVar11);
        auVar20 = vpermq_avx2(auVar10,0x4e);
        auVar15 = vpmullw_avx2(auVar20,auVar11);
        auVar13 = vpmulhw_avx2(auVar20,auVar11);
        auVar18 = vpunpcklwd_avx2(auVar14,auVar12);
        auVar59 = vpaddd_avx2(auVar18,auVar59);
        auVar18 = vpunpcklwd_avx2(auVar15,auVar13);
        auVar49 = vpaddd_avx2(auVar18,auVar49);
        auVar18 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar4 + lVar26 + lVar40 + 0x10));
        auVar16 = vpmullw_avx2(auVar18,auVar10);
        auVar10 = vpmulhw_avx2(auVar10,auVar18);
        auVar19 = vpunpcklwd_avx2(auVar16,auVar10);
        auVar55 = vpaddd_avx2(auVar55,auVar19);
        auVar17 = vpmullw_avx2(auVar20,auVar18);
        auVar19 = vpmulhw_avx2(auVar20,auVar18);
        auVar20 = vpunpcklwd_avx2(auVar17,auVar19);
        auVar53 = vpaddd_avx2(auVar53,auVar20);
        auVar12 = vpunpckhwd_avx2(auVar14,auVar12);
        auVar59 = vpaddd_avx2(auVar59,auVar12);
        auVar60 = ZEXT3264(auVar59);
        auVar59 = vpunpckhwd_avx2(auVar15,auVar13);
        auVar49 = vpaddd_avx2(auVar49,auVar59);
        auVar58 = ZEXT3264(auVar49);
        auVar49 = vpunpckhwd_avx2(auVar16,auVar10);
        auVar55 = vpaddd_avx2(auVar55,auVar49);
        auVar56 = ZEXT3264(auVar55);
        auVar55 = vpunpckhwd_avx2(auVar17,auVar19);
        auVar53 = vpaddd_avx2(auVar53,auVar55);
        auVar54 = ZEXT3264(auVar53);
        auVar53 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar37 + lVar26 + 0x10));
        auVar12 = vpmullw_avx2(auVar11,auVar53);
        auVar59 = vpmulhw_avx2(auVar11,auVar53);
        auVar55 = vpermq_avx2(auVar53,0x4e);
        auVar13 = vpmullw_avx2(auVar55,auVar11);
        auVar10 = vpmulhw_avx2(auVar55,auVar11);
        auVar19 = vpmullw_avx2(auVar18,auVar53);
        auVar11 = vpmulhw_avx2(auVar18,auVar53);
        auVar14 = vpmullw_avx2(auVar55,auVar18);
        auVar18 = vpmulhw_avx2(auVar55,auVar18);
        auVar53 = vpunpcklwd_avx2(auVar12,auVar59);
        auVar51 = vpaddd_avx2(auVar53,auVar51);
        auVar53 = vpunpcklwd_avx2(auVar13,auVar10);
        auVar53 = vpaddd_avx2(auVar53,auVar65);
        auVar55 = vpunpcklwd_avx2(auVar19,auVar11);
        auVar55 = vpaddd_avx2(auVar55,auVar63);
        auVar49 = vpunpcklwd_avx2(auVar14,auVar18);
        auVar49 = vpaddd_avx2(auVar49,auVar61);
        auVar59 = vpunpckhwd_avx2(auVar12,auVar59);
        auVar51 = vpaddd_avx2(auVar51,auVar59);
        auVar52 = ZEXT3264(auVar51);
        auVar51 = vpunpckhwd_avx2(auVar13,auVar10);
        auVar51 = vpaddd_avx2(auVar53,auVar51);
        auVar66 = ZEXT3264(auVar51);
        auVar51 = vpunpckhwd_avx2(auVar19,auVar11);
        auVar51 = vpaddd_avx2(auVar55,auVar51);
        auVar64 = ZEXT3264(auVar51);
        auVar51 = vpunpckhwd_avx2(auVar14,auVar18);
        auVar51 = vpaddd_avx2(auVar49,auVar51);
        auVar62 = ZEXT3264(auVar51);
        lVar26 = lVar26 + 0x20;
        local_98 = auVar61;
        local_78 = auVar65;
        local_58 = auVar63;
      }
      auVar10 = vpunpckldq_avx2(auVar59,auVar49);
      auVar11 = vpunpckldq_avx2(auVar55,auVar53);
      auVar49 = vpunpckhdq_avx2(auVar59,auVar49);
      auVar55 = vpunpckhdq_avx2(auVar55,auVar53);
      auVar59 = vpunpcklqdq_avx2(auVar10,auVar11);
      auVar53 = vpunpckhqdq_avx2(auVar10,auVar11);
      auVar53 = vpaddd_avx2(auVar59,auVar53);
      auVar59 = vpunpcklqdq_avx2(auVar49,auVar55);
      auVar55 = vpunpckhqdq_avx2(auVar49,auVar55);
      auVar55 = vpaddd_avx2(auVar55,auVar59);
      auVar53 = vpaddd_avx2(auVar53,auVar55);
      auVar59 = vpunpckldq_avx2(auVar51,auVar65);
      auVar10 = vpunpckldq_avx2(auVar63,auVar61);
      auVar55 = vpunpckhdq_avx2(auVar51,auVar65);
      auVar49 = vpunpckhdq_avx2(auVar63,auVar61);
      auVar61 = vpunpcklqdq_avx2(auVar59,auVar10);
      auVar51 = vpunpckhqdq_avx2(auVar59,auVar10);
      *puVar41 = auVar53._0_4_;
      *puVar43 = auVar53._20_4_;
      *puVar44 = auVar53._8_4_;
      *puVar46 = auVar53._28_4_;
      puVar41[1] = auVar53._4_4_;
      auVar51 = vpaddd_avx2(auVar61,auVar51);
      auVar59 = vpunpcklqdq_avx2(auVar55,auVar49);
      auVar55 = vpunpckhqdq_avx2(auVar55,auVar49);
      puVar43[1] = auVar53._16_4_;
      puVar44[1] = auVar53._12_4_;
      puVar46[1] = auVar53._24_4_;
      auVar53 = vpaddd_avx2(auVar55,auVar59);
      auVar51 = vpaddd_avx2(auVar51,auVar53);
      puVar41[2] = auVar51._0_4_;
      puVar43[2] = auVar51._20_4_;
      puVar44[2] = auVar51._8_4_;
      puVar46[2] = auVar51._28_4_;
      puVar41[3] = auVar51._4_4_;
      puVar43[3] = auVar51._16_4_;
      puVar44[3] = auVar51._12_4_;
      puVar46[3] = auVar51._24_4_;
      puVar41 = puVar41 + 4;
      puVar43 = puVar43 + 4;
      puVar44 = puVar44 + 4;
      puVar46 = puVar46 + 4;
      pvVar37 = (void *)((long)pvVar37 + local_108._16_8_ * local_c8);
    }
    lVar40 = kernel->cstep * kernel->elemsize * uVar31;
    pvVar4 = kernel->data;
    bVar22 = 0;
    for (; (int)((uint)uVar42 | 1) < (int)uVar3; uVar42 = (ulong)((uint)uVar42 + 2)) {
      auVar52 = ZEXT1664((undefined1  [16])0x0);
      lVar26 = 0;
      auVar54 = ZEXT1664((undefined1  [16])0x0);
      auVar56 = ZEXT1664((undefined1  [16])0x0);
      auVar58 = ZEXT1664((undefined1  [16])0x0);
      uVar32 = uVar29;
      while( true ) {
        iVar28 = (int)uVar32;
        uVar32 = (ulong)(iVar28 - 1);
        auVar55 = auVar56._0_32_;
        auVar49 = auVar58._0_32_;
        auVar51 = auVar52._0_32_;
        auVar53 = auVar54._0_32_;
        if (iVar28 == 0) break;
        auVar59 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                  (local_108._0_8_ +
                                  lVar26 + (ulong)((bVar22 & 1) + ((uint)(uVar42 >> 2) & 0x3fffffff)
                                                  ) * local_108._16_8_ * local_c8));
        auVar61 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar4 + lVar26 * 2 + lVar40));
        auVar63 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)pvVar4 + lVar26 * 2 + lVar40 + 0x10));
        auVar10 = vpmullw_avx2(auVar61,auVar59);
        auVar65 = vpmulhw_avx2(auVar59,auVar61);
        auVar13 = vpermq_avx2(auVar59,0x4e);
        auVar11 = vpmullw_avx2(auVar13,auVar61);
        auVar61 = vpmulhw_avx2(auVar13,auVar61);
        auVar18 = vpmullw_avx2(auVar63,auVar59);
        auVar59 = vpmulhw_avx2(auVar59,auVar63);
        auVar12 = vpmullw_avx2(auVar13,auVar63);
        auVar63 = vpmulhw_avx2(auVar13,auVar63);
        auVar13 = vpunpcklwd_avx2(auVar10,auVar65);
        auVar49 = vpaddd_avx2(auVar13,auVar49);
        auVar13 = vpunpcklwd_avx2(auVar11,auVar61);
        auVar55 = vpaddd_avx2(auVar13,auVar55);
        auVar13 = vpunpcklwd_avx2(auVar18,auVar59);
        auVar53 = vpaddd_avx2(auVar13,auVar53);
        auVar13 = vpunpcklwd_avx2(auVar12,auVar63);
        auVar51 = vpaddd_avx2(auVar13,auVar51);
        auVar65 = vpunpckhwd_avx2(auVar10,auVar65);
        auVar49 = vpaddd_avx2(auVar49,auVar65);
        auVar58 = ZEXT3264(auVar49);
        auVar49 = vpunpckhwd_avx2(auVar11,auVar61);
        auVar55 = vpaddd_avx2(auVar55,auVar49);
        auVar56 = ZEXT3264(auVar55);
        auVar55 = vpunpckhwd_avx2(auVar18,auVar59);
        auVar53 = vpaddd_avx2(auVar53,auVar55);
        auVar54 = ZEXT3264(auVar53);
        auVar53 = vpunpckhwd_avx2(auVar12,auVar63);
        auVar51 = vpaddd_avx2(auVar51,auVar53);
        auVar52 = ZEXT3264(auVar51);
        lVar26 = lVar26 + 0x10;
      }
      auVar59 = vpunpckldq_avx2(auVar49,auVar55);
      auVar61 = vpunpckldq_avx2(auVar53,auVar51);
      auVar55 = vpunpckhdq_avx2(auVar49,auVar55);
      auVar53 = vpunpckhdq_avx2(auVar53,auVar51);
      auVar49 = vpunpcklqdq_avx2(auVar59,auVar61);
      auVar51 = vpunpckhqdq_avx2(auVar59,auVar61);
      auVar51 = vpaddd_avx2(auVar49,auVar51);
      auVar49 = vpunpcklqdq_avx2(auVar55,auVar53);
      auVar53 = vpunpckhqdq_avx2(auVar55,auVar53);
      auVar53 = vpaddd_avx2(auVar53,auVar49);
      auVar51 = vpaddd_avx2(auVar51,auVar53);
      *puVar41 = auVar51._0_4_;
      *puVar43 = auVar51._20_4_;
      *puVar44 = auVar51._8_4_;
      *puVar46 = auVar51._28_4_;
      puVar41[1] = auVar51._4_4_;
      puVar43[1] = auVar51._16_4_;
      puVar44[1] = auVar51._12_4_;
      puVar46[1] = auVar51._24_4_;
      puVar41 = puVar41 + 2;
      puVar43 = puVar43 + 2;
      puVar44 = puVar44 + 2;
      puVar46 = puVar46 + 2;
      bVar22 = bVar22 + 1;
    }
    sVar5 = kernel->cstep;
    sVar6 = kernel->elemsize;
    pvVar4 = kernel->data;
    while( true ) {
      uVar30 = (uint)uVar42;
      if ((int)uVar3 <= (int)uVar30) break;
      auVar52 = ZEXT1664((undefined1  [16])0x0);
      auVar54 = ZEXT1664((undefined1  [16])0x0);
      pauVar24 = (undefined1 (*) [16])(sVar5 * uVar31 * sVar6 + (long)pvVar4);
      for (lVar40 = 0; iVar23 != (int)lVar40; lVar40 = lVar40 + 1) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)(local_108._0_8_ +
                                 lVar40 * 8 +
                                 (ulong)((uVar30 & 1) + ((uint)(uVar42 >> 2) & 0x3fffffff) +
                                        (uint)((uVar30 >> 1 & 1) != 0)) *
                                 local_108._16_8_ * local_c8);
        auVar1 = vpmovsxbw_avx(auVar1);
        auVar51 = vpmovsxbw_avx2(*pauVar24);
        auVar53 = vpmovsxbw_avx2(pauVar24[1]);
        auVar49._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
        auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
        auVar59 = vpmullw_avx2(auVar49,auVar51);
        auVar55 = vpmulhw_avx2(auVar49,auVar51);
        auVar61 = vpmullw_avx2(auVar49,auVar53);
        auVar49 = vpmulhw_avx2(auVar49,auVar53);
        auVar51 = vpunpcklwd_avx2(auVar59,auVar55);
        auVar51 = vpaddd_avx2(auVar54._0_32_,auVar51);
        auVar53 = vpunpcklwd_avx2(auVar61,auVar49);
        auVar53 = vpaddd_avx2(auVar52._0_32_,auVar53);
        auVar55 = vpunpckhwd_avx2(auVar59,auVar55);
        auVar51 = vpaddd_avx2(auVar51,auVar55);
        auVar54 = ZEXT3264(auVar51);
        auVar51 = vpunpckhwd_avx2(auVar61,auVar49);
        auVar51 = vpaddd_avx2(auVar53,auVar51);
        auVar52 = ZEXT3264(auVar51);
        pauVar24 = pauVar24 + 2;
      }
      auVar1 = vpunpckldq_avx(auVar54._0_16_,auVar54._16_16_);
      auVar50 = vpunpckldq_avx(auVar52._0_16_,auVar52._16_16_);
      auVar57 = vpunpckhdq_avx(auVar54._0_16_,auVar54._16_16_);
      auVar48 = vpunpckhdq_avx(auVar52._0_16_,auVar52._16_16_);
      auVar9 = vpunpcklqdq_avx(auVar1,auVar50);
      auVar1 = vpunpckhqdq_avx(auVar1,auVar50);
      auVar1 = vpaddd_avx(auVar9,auVar1);
      auVar50 = vpunpcklqdq_avx(auVar57,auVar48);
      auVar57 = vpunpckhqdq_avx(auVar57,auVar48);
      auVar57 = vpaddd_avx(auVar57,auVar50);
      auVar1 = vpaddd_avx(auVar1,auVar57);
      *puVar41 = auVar1._0_4_;
      *puVar43 = auVar1._4_4_;
      *puVar44 = auVar1._8_4_;
      *puVar46 = auVar1._12_4_;
      puVar41 = puVar41 + 1;
      puVar43 = puVar43 + 1;
      puVar44 = puVar44 + 1;
      puVar46 = puVar46 + 1;
      uVar42 = (ulong)(uVar30 + 1);
    }
  }
  pvVar4 = local_b8->data;
  sVar5 = local_b8->elemsize;
  sVar6 = local_b8->cstep;
  for (uVar29 = local_c0 & 0xfffffffffffffffc; (long)uVar29 < (long)local_c0; uVar29 = uVar29 + 1) {
    uVar31 = (ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 | uVar29 & 0xffffffff;
    lVar40 = (long)((int)((long)uVar31 % 4) + (int)((long)uVar31 / 4));
    sVar7 = kernel->cstep;
    sVar8 = kernel->elemsize;
    pauVar24 = (undefined1 (*) [16])(sVar5 * sVar6 * uVar29 + (long)pvVar4);
    pvVar37 = kernel->data;
    for (uVar31 = 0; (long)(uVar31 | 3) < (long)uVar47; uVar31 = uVar31 + 4) {
      pauVar34 = (undefined1 (*) [16])
                 ((uVar31 >> 2) * local_108._16_8_ * local_c8 + local_108._0_8_);
      auVar52 = ZEXT1664((undefined1  [16])0x0);
      lVar26 = 0;
      auVar54 = ZEXT1664((undefined1  [16])0x0);
      auVar56 = ZEXT1664((undefined1  [16])0x0);
      auVar58 = ZEXT1664((undefined1  [16])0x0);
      while( true ) {
        if (iVar23 == (int)lVar26) break;
        auVar51 = vpmovsxbw_avx2(*pauVar34);
        auVar53 = vpmovsxbw_avx2(pauVar34[1]);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = *(ulong *)((long)pvVar37 + lVar26 * 8 + sVar7 * lVar40 * sVar8);
        auVar55 = vpmovsxbw_avx2(auVar57);
        auVar61 = vpermq_avx2(auVar55,0x44);
        auVar49 = vpmullw_avx2(auVar61,auVar51);
        auVar55 = vpmulhw_avx2(auVar51,auVar61);
        auVar59 = vpmullw_avx2(auVar61,auVar53);
        auVar53 = vpmulhw_avx2(auVar53,auVar61);
        auVar51 = vpunpcklwd_avx2(auVar49,auVar55);
        auVar51 = vpaddd_avx2(auVar52._0_32_,auVar51);
        auVar52 = ZEXT3264(auVar51);
        auVar51 = vpunpckhwd_avx2(auVar49,auVar55);
        auVar51 = vpaddd_avx2(auVar54._0_32_,auVar51);
        auVar54 = ZEXT3264(auVar51);
        auVar51 = vpunpcklwd_avx2(auVar59,auVar53);
        auVar51 = vpaddd_avx2(auVar56._0_32_,auVar51);
        auVar56 = ZEXT3264(auVar51);
        auVar51 = vpunpckhwd_avx2(auVar59,auVar53);
        auVar51 = vpaddd_avx2(auVar58._0_32_,auVar51);
        auVar58 = ZEXT3264(auVar51);
        pauVar34 = pauVar34 + 2;
        lVar26 = lVar26 + 1;
      }
      auVar51 = vpaddd_avx2(auVar54._0_32_,auVar52._0_32_);
      auVar53 = vpaddd_avx2(auVar58._0_32_,auVar56._0_32_);
      auVar1 = vpshufd_avx(auVar51._0_16_,0xee);
      auVar1 = vpaddd_avx(auVar1,auVar51._0_16_);
      auVar57 = vpshufd_avx(auVar51._16_16_,0xee);
      auVar57 = vpaddd_avx(auVar57,auVar51._16_16_);
      auVar57 = vphaddd_avx(auVar1,auVar57);
      auVar1 = vpshufd_avx(auVar53._0_16_,0xee);
      auVar1 = vpaddd_avx(auVar1,auVar53._0_16_);
      auVar48 = vphaddd_avx(auVar1,auVar1);
      auVar1 = vpshufd_avx(auVar53._16_16_,0xee);
      auVar1 = vpaddd_avx(auVar1,auVar53._16_16_);
      auVar1 = vphaddd_avx(auVar1,auVar1);
      auVar57 = vpshufd_avx(auVar57,0xe8);
      auVar57 = vpunpcklqdq_avx(auVar57,auVar48);
      auVar48._0_4_ = auVar1._0_4_;
      auVar48._4_4_ = auVar48._0_4_;
      auVar48._8_4_ = auVar48._0_4_;
      auVar48._12_4_ = auVar48._0_4_;
      auVar1 = vpblendd_avx2(auVar57,auVar48,8);
      *pauVar24 = auVar1;
      pauVar24 = pauVar24 + 1;
    }
    sVar7 = kernel->cstep;
    sVar8 = kernel->elemsize;
    pvVar37 = kernel->data;
    while (uVar30 = (uint)uVar31, (int)(uVar30 | 1) < (int)uVar3) {
      pauVar34 = (undefined1 (*) [16])
                 ((ulong)(((uint)(uVar31 >> 2) & 0x3fffffff) + (uint)((uVar30 >> 1 & 1) != 0)) *
                  local_108._16_8_ * local_c8 + local_108._0_8_);
      auVar52 = ZEXT1664((undefined1  [16])0x0);
      lVar26 = 0;
      auVar54 = ZEXT1664((undefined1  [16])0x0);
      while( true ) {
        if (iVar23 == (int)lVar26) break;
        auVar51 = vpmovsxbw_avx2(*pauVar34);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)((long)pvVar37 + lVar26 * 8 + sVar7 * lVar40 * sVar8);
        auVar53 = vpmovsxbw_avx2(auVar50);
        auVar53 = vpermq_avx2(auVar53,0x44);
        auVar55 = vpmullw_avx2(auVar53,auVar51);
        auVar53 = vpmulhw_avx2(auVar51,auVar53);
        auVar51 = vpunpcklwd_avx2(auVar55,auVar53);
        auVar51 = vpaddd_avx2(auVar52._0_32_,auVar51);
        auVar52 = ZEXT3264(auVar51);
        auVar51 = vpunpckhwd_avx2(auVar55,auVar53);
        auVar51 = vpaddd_avx2(auVar54._0_32_,auVar51);
        auVar54 = ZEXT3264(auVar51);
        pauVar34 = pauVar34 + 1;
        lVar26 = lVar26 + 1;
      }
      auVar51 = vpaddd_avx2(auVar54._0_32_,auVar52._0_32_);
      auVar1 = vpshufd_avx(auVar51._0_16_,0xee);
      auVar1 = vpaddd_avx(auVar1,auVar51._0_16_);
      auVar57 = vpshufd_avx(auVar51._16_16_,0xee);
      auVar57 = vpaddd_avx(auVar57,auVar51._16_16_);
      auVar1 = vphaddd_avx(auVar1,auVar57);
      auVar1 = vpshufd_avx(auVar1,0xe8);
      *(long *)*pauVar24 = auVar1._0_8_;
      pauVar24 = (undefined1 (*) [16])(*pauVar24 + 8);
      uVar31 = (ulong)(uVar30 + 2);
    }
    sVar7 = kernel->cstep;
    sVar8 = kernel->elemsize;
    pvVar37 = kernel->data;
    while( true ) {
      uVar30 = (uint)uVar31;
      if ((int)uVar3 <= (int)uVar30) break;
      auVar52 = ZEXT1664((undefined1  [16])0x0);
      lVar26 = 0;
      auVar54 = ZEXT1664((undefined1  [16])0x0);
      while( true ) {
        if (iVar23 == (int)lVar26) break;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(local_108._0_8_ +
                                 lVar26 * 8 +
                                 (ulong)((uVar30 & 1) + ((uint)(uVar31 >> 2) & 0x3fffffff) +
                                        (uint)((uVar30 >> 1 & 1) != 0)) *
                                 local_108._16_8_ * local_c8);
        auVar1 = vpmovsxbw_avx(auVar9);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)((long)pvVar37 + lVar26 * 8 + lVar40 * sVar7 * sVar8);
        auVar57 = vpmovsxbw_avx(auVar2);
        auVar48 = vpmullw_avx(auVar57,auVar1);
        auVar57 = vpmulhw_avx(auVar1,auVar57);
        auVar1 = vpunpcklwd_avx(auVar48,auVar57);
        auVar1 = vpaddd_avx(auVar52._0_16_,auVar1);
        auVar52 = ZEXT1664(auVar1);
        auVar1 = vpunpckhwd_avx(auVar48,auVar57);
        auVar1 = vpaddd_avx(auVar54._0_16_,auVar1);
        auVar54 = ZEXT1664(auVar1);
        lVar26 = lVar26 + 1;
      }
      auVar1 = vpaddd_avx(auVar54._0_16_,auVar52._0_16_);
      auVar1 = vphaddd_avx(auVar1,auVar1);
      auVar1 = vphaddd_avx(auVar1,auVar1);
      *(int *)*pauVar24 = auVar1._0_4_;
      pauVar24 = (undefined1 (*) [16])(*pauVar24 + 4);
      uVar31 = (ulong)(uVar30 + 1);
    }
  }
  piVar21 = (int *)CONCAT44(local_108._12_4_,local_108._8_4_);
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if ((Allocator *)local_108._32_8_ == (Allocator *)0x0) {
        free((void *)local_108._0_8_);
      }
      else {
        (*(*(_func_int ***)local_108._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}